

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isLinearCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec2 *depths,Vec2 *fBounds,
               float cmpReference,float result,bool isFixedPointDepth)

{
  bool bVar1;
  CmpResultSet CVar2;
  CmpResultSet CVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float y;
  float fVar10;
  float local_90;
  float local_88;
  float maxR;
  float minR;
  float maxV;
  float minV;
  float v1;
  float v0;
  float ref1;
  float ref0;
  bool cmp1True;
  bool cmp0True;
  deUint32 comb;
  float totalErr;
  float resErr;
  float pcfErr;
  float f1;
  float f0;
  deUint32 isFalse;
  deUint32 isTrue;
  CmpResultSet cmp1;
  CmpResultSet cmp0;
  float d1;
  float d0;
  bool isFixedPointDepth_local;
  float result_local;
  float cmpReference_local;
  Vec2 *fBounds_local;
  Vec2 *depths_local;
  TexComparePrecision *prec_local;
  CompareMode compareMode_local;
  
  pfVar4 = Vector<float,_2>::operator[](depths,0);
  fVar5 = *pfVar4;
  pfVar4 = Vector<float,_2>::operator[](depths,1);
  fVar6 = *pfVar4;
  CVar2 = execCompare(compareMode,fVar5,cmpReference,prec->referenceBits,isFixedPointDepth);
  CVar3 = execCompare(compareMode,fVar6,cmpReference,prec->referenceBits,isFixedPointDepth);
  isFalse._2_1_ = CVar2.isTrue;
  isFalse._0_1_ = CVar3.isTrue;
  isFalse._3_1_ = CVar2.isFalse;
  isFalse._1_1_ = CVar3.isFalse;
  fVar5 = Vector<float,_2>::x(fBounds);
  fVar6 = Vector<float,_2>::y(fBounds);
  fVar7 = TexVerifierUtil::computeFixedPointError(prec->pcfBits);
  fVar8 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
  ref0 = 0.0;
  do {
    if (3 < (uint)ref0) {
      return false;
    }
    if (((uint)ref0 & ((uint)(isFalse._2_1_ & 1) | (uint)(isFalse._0_1_ & 1) << 1) |
        ((uint)ref0 ^ 0xffffffff) & ((uint)(isFalse._3_1_ & 1) | (uint)(isFalse._1_1_ & 1) << 1)) ==
        3) {
      local_88 = 1.0;
      if (((uint)ref0 & 1) == 0) {
        local_88 = 0.0;
      }
      local_90 = 1.0;
      if (((uint)ref0 >> 1 & 1) == 0) {
        local_90 = 0.0;
      }
      fVar9 = local_88 * (1.0 - fVar5) + local_90 * fVar5;
      y = local_88 * (1.0 - fVar6) + local_90 * fVar6;
      fVar10 = de::min<float>(fVar9,y);
      fVar9 = de::max<float>(fVar9,y);
      bVar1 = de::inRange<float>(result,fVar10 - (fVar7 + fVar8),fVar9 + fVar7 + fVar8);
      if (bVar1) {
        return true;
      }
    }
    ref0 = (float)((int)ref0 + 1);
  } while( true );
}

Assistant:

static bool isLinearCompareValid (const Sampler::CompareMode	compareMode,
								  const TexComparePrecision&	prec,
								  const Vec2&					depths,
								  const Vec2&					fBounds,
								  const float					cmpReference,
								  const float					result,
								  const bool					isFixedPointDepth)
{
	DE_ASSERT(0.0f <= fBounds.x() && fBounds.x() <= fBounds.y() && fBounds.y() <= 1.0f);

	const float			d0			= depths[0];
	const float			d1			= depths[1];

	const CmpResultSet	cmp0		= execCompare(compareMode, d0, cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp1		= execCompare(compareMode, d1, cmpReference, prec.referenceBits, isFixedPointDepth);

	const deUint32		isTrue		= (deUint32(cmp0.isTrue)<<0)
									| (deUint32(cmp1.isTrue)<<1);
	const deUint32		isFalse		= (deUint32(cmp0.isFalse)<<0)
									| (deUint32(cmp1.isFalse)<<1);

	// Interpolation parameters
	const float			f0			= fBounds.x();
	const float			f1			= fBounds.y();

	// Error parameters
	const float			pcfErr		= computeFixedPointError(prec.pcfBits);
	const float			resErr		= computeFixedPointError(prec.resultBits);
	const float			totalErr	= pcfErr+resErr;

	// Iterate over all valid combinations.
	for (deUint32 comb = 0; comb < (1<<2); comb++)
	{
		// Filter out invalid combinations.
		if (((comb & isTrue) | (~comb & isFalse)) != (1<<2)-1)
			continue;

		const bool		cmp0True	= ((comb>>0)&1) != 0;
		const bool		cmp1True	= ((comb>>1)&1) != 0;

		const float		ref0		= cmp0True ? 1.0f : 0.0f;
		const float		ref1		= cmp1True ? 1.0f : 0.0f;

		const float		v0			= ref0*(1.0f-f0) + ref1*f0;
		const float		v1			= ref0*(1.0f-f1) + ref1*f1;
		const float		minV		= de::min(v0, v1);
		const float		maxV		= de::max(v0, v1);
		const float		minR		= minV-totalErr;
		const float		maxR		= maxV+totalErr;

		if (de::inRange(result, minR, maxR))
			return true;
	}

	return false;
}